

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

void Abc_NtkMiterReport(Abc_Ntk_t *pMiter)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  uint local_24;
  int i;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pChild;
  Abc_Ntk_t *pMiter_local;
  
  iVar1 = Abc_NtkPoNum(pMiter);
  if (iVar1 == 1) {
    pAVar2 = Abc_NtkPo(pMiter,0);
    pAVar2 = Abc_ObjChild0(pAVar2);
    iVar1 = Abc_AigNodeIsConst(pAVar2);
    if (iVar1 == 0) {
      printf("Satisfiable.\n");
    }
    else {
      iVar1 = Abc_ObjIsComplement(pAVar2);
      if (iVar1 == 0) {
        printf("Satisfiable. (Constant 1).\n");
      }
      else {
        printf("Unsatisfiable.\n");
      }
    }
  }
  else {
    for (local_24 = 0; iVar1 = Abc_NtkPoNum(pMiter), (int)local_24 < iVar1; local_24 = local_24 + 1)
    {
      Abc_NtkPo(pMiter,local_24);
      pAVar2 = Abc_NtkPo(pMiter,local_24);
      pAVar2 = Abc_ObjChild0(pAVar2);
      printf("Output #%2d : ",(ulong)local_24);
      iVar1 = Abc_AigNodeIsConst(pAVar2);
      if (iVar1 == 0) {
        printf("Satisfiable.\n");
      }
      else {
        iVar1 = Abc_ObjIsComplement(pAVar2);
        if (iVar1 == 0) {
          printf("Satisfiable. (Constant 1).\n");
        }
        else {
          printf("Unsatisfiable.\n");
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMiterReport( Abc_Ntk_t * pMiter )
{
    Abc_Obj_t * pChild, * pNode;
    int i;
    if ( Abc_NtkPoNum(pMiter) == 1 )
    {
        pChild = Abc_ObjChild0( Abc_NtkPo(pMiter,0) );
        if ( Abc_AigNodeIsConst(pChild) )
        {
            if ( Abc_ObjIsComplement(pChild) )
                printf( "Unsatisfiable.\n" );
            else
                printf( "Satisfiable. (Constant 1).\n" );
        }
        else
            printf( "Satisfiable.\n" );
    }
    else
    {
        Abc_NtkForEachPo( pMiter, pNode, i )
        {
            pChild = Abc_ObjChild0( Abc_NtkPo(pMiter,i) );
            printf( "Output #%2d : ", i );
            if ( Abc_AigNodeIsConst(pChild) )
            {
                if ( Abc_ObjIsComplement(pChild) )
                    printf( "Unsatisfiable.\n" );
                else
                    printf( "Satisfiable. (Constant 1).\n" );
            }
            else
                printf( "Satisfiable.\n" );
        }
    }
}